

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConeX(BulletEngine *this,aphy_scalar radius,aphy_scalar height)

{
  btCollisionShape *handle;
  BulletCollisionShape *this_00;
  collision_shape_ptr prVar1;
  
  handle = (btCollisionShape *)btAlignedAllocInternal(0x60,0x10);
  btConeShapeX::btConeShapeX((btConeShapeX *)handle,radius,height);
  this_00 = (BulletCollisionShape *)operator_new(0x20);
  BulletCollisionShape::BulletCollisionShape(this_00,handle,Generic);
  prVar1 = (collision_shape_ptr)operator_new(0x18);
  prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar1->object = (collision_shape *)this_00;
  prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_00->super_collision_shape).super_base_interface.myRefCounter = prVar1;
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConeX(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShapeX(radius, height)
    ).disown();
}